

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintThreeBBShaft::Build_CqT
          (ChConstraintThreeBBShaft *this,ChSparseMatrix *storage,int inscol)

{
  int iVar1;
  ChVariables *pCVar2;
  int i;
  long lVar3;
  
  pCVar2 = (this->super_ChConstraintThree).variables_a;
  if (pCVar2->disabled == false) {
    iVar1 = pCVar2->offset;
    lVar3 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[lVar3],storage,(ulong)(uint)(iVar1 + (int)lVar3),(ulong)(uint)inscol,
                 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
  }
  pCVar2 = (this->super_ChConstraintThree).variables_b;
  if (pCVar2->disabled == false) {
    iVar1 = pCVar2->offset;
    lVar3 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[lVar3],storage,(ulong)(uint)(iVar1 + (int)lVar3),(ulong)(uint)inscol,
                 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
  }
  pCVar2 = (this->super_ChConstraintThree).variables_c;
  if (pCVar2->disabled != false) {
    return;
  }
  (**storage->_vptr_SparseMatrix)
            ((this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.
             m_data.array[0],storage,(ulong)(uint)pCVar2->offset,(ulong)(uint)inscol,1);
  return;
}

Assistant:

void ChConstraintThreeBBShaft::Build_CqT(ChSparseMatrix& storage, int inscol) {
    if (variables_a->IsActive())
        PasteMatrix(storage, Cq_a.transpose(), variables_a->GetOffset(), inscol);
    if (variables_b->IsActive())
        PasteMatrix(storage, Cq_b.transpose(), variables_b->GetOffset(), inscol);
    if (variables_c->IsActive())
        PasteMatrix(storage, Cq_c.transpose(), variables_c->GetOffset(), inscol);
}